

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_input_any_mouse_click_in_rect(nk_input *in,nk_rect b)

{
  nk_rect b_00;
  nk_bool nVar1;
  nk_input *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  float unaff_retaddr;
  int down;
  int i;
  undefined1 local_21;
  undefined4 local_20;
  nk_buttons id;
  undefined4 uVar2;
  
  uVar2 = (undefined4)((ulong)in_XMM0_Qa >> 0x20);
  local_20 = 0;
  for (id = NK_BUTTON_LEFT; (int)id < 4; id = id + NK_BUTTON_MIDDLE) {
    local_21 = true;
    if (local_20 == 0) {
      b_00.y = (float)(int)in_XMM1_Qa;
      b_00.w = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
      b_00.x = (float)uVar2;
      b_00.h = unaff_retaddr;
      nVar1 = nk_input_is_mouse_click_in_rect(in_RDI,id,b_00);
      local_21 = nVar1 != 0;
    }
    local_20 = (uint)local_21;
  }
  return local_20;
}

Assistant:

NK_API nk_bool
nk_input_any_mouse_click_in_rect(const struct nk_input *in, struct nk_rect b)
{
int i, down = 0;
for (i = 0; i < NK_BUTTON_MAX; ++i)
down = down || nk_input_is_mouse_click_in_rect(in, (enum nk_buttons)i, b);
return down;
}